

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  ostream *poVar6;
  pointer pdVar7;
  char *pcVar8;
  ifstream *input_stream;
  double dVar9;
  allocator local_4e9;
  int num_bin;
  int output_interval;
  vector<double,_std::allocator<double>_> data;
  double upper_bound;
  double lower_bound;
  vector<double,_std::allocator<double>_> histogram;
  vector<double,_std::allocator<double>_> data_1;
  Buffer buffer;
  ostringstream error_message_7;
  StatisticsAccumulation statistics_accumulation;
  HistogramCalculation histogram_calculation;
  ifstream ifs;
  byte abStack_218 [488];
  
  output_interval = -1;
  num_bin = 10;
  lower_bound = 0.0;
  upper_bound = 1.0;
  bVar1 = false;
  do {
    iVar5 = ya_getopt_long(argc,argv,"t:b:l:u:nh",(option *)0x0,(int *)0x0);
    switch(iVar5) {
    case 0x6c:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar3 = sptk::ConvertStringToDouble((string *)&ifs,&lower_bound);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -l option must be numeric");
        std::__cxx11::string::string((string *)&error_message_7,"histogram",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_001039d1;
      }
      break;
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
switchD_00103650_caseD_6d:
      anon_unknown.dwarf_2cc1::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x6e:
      bVar1 = true;
      break;
    case 0x74:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&output_interval);
      bVar3 = output_interval < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -t option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_7,"histogram",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_001039d1;
      }
      break;
    case 0x75:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar3 = sptk::ConvertStringToDouble((string *)&ifs,&upper_bound);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -u option must be numeric");
        std::__cxx11::string::string((string *)&error_message_7,"histogram",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
        goto LAB_001039d1;
      }
      break;
    default:
      if (iVar5 != 0x62) {
        if (iVar5 != -1) {
          if (iVar5 == 0x68) {
            anon_unknown.dwarf_2cc1::PrintUsage((ostream *)&std::cout);
            return 0;
          }
          goto switchD_00103650_caseD_6d;
        }
        if (upper_bound <= lower_bound) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Upper bound must be greater than lower bound");
          std::__cxx11::string::string((string *)&error_message_7,"histogram",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
          goto LAB_001039d1;
        }
        if (1 < argc - ya_optind) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Too many input files");
          std::__cxx11::string::string((string *)&error_message_7,"histogram",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
          goto LAB_001039d1;
        }
        if (argc == ya_optind) {
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = argv[ya_optind];
        }
        bVar3 = sptk::SetBinaryMode();
        if (!bVar3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"Cannot set translation mode");
          std::__cxx11::string::string((string *)&error_message_7,"histogram",(allocator *)&buffer);
          sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
          goto LAB_001039d1;
        }
        input_stream = &ifs;
        std::ifstream::ifstream(input_stream);
        if ((pcVar8 == (char *)0x0) ||
           (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar8),
           (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
          cVar4 = std::__basic_file<char>::is_open();
          if (cVar4 == '\0') {
            input_stream = (ifstream *)&std::cin;
          }
          sptk::HistogramCalculation::HistogramCalculation
                    (&histogram_calculation,num_bin,lower_bound,upper_bound);
          if (histogram_calculation.is_valid_ != false) {
            std::vector<double,_std::allocator<double>_>::vector
                      (&histogram,(long)num_bin,(allocator_type *)&error_message_7);
            if ((long)output_interval == 0xffffffffffffffff) {
              std::vector<double,_std::allocator<double>_>::vector
                        (&data_1,1,(allocator_type *)&error_message_7);
              sptk::StatisticsAccumulation::StatisticsAccumulation
                        (&statistics_accumulation,num_bin + -1,1,false,false);
              sptk::StatisticsAccumulation::Buffer::Buffer(&buffer);
              goto LAB_00103d37;
            }
            std::vector<double,_std::allocator<double>_>::vector
                      (&data,(long)output_interval,(allocator_type *)&error_message_7);
            iVar5 = 0;
            goto LAB_00103baa;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
          std::operator<<((ostream *)&error_message_7,"Failed to initialize HistogramCalculation");
          std::__cxx11::string::string((string *)&buffer,"histogram",(allocator *)&data);
          sptk::PrintErrorMessage((string *)&buffer,&error_message_7);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
          poVar6 = std::operator<<((ostream *)&error_message_7,"Cannot open file ");
          std::operator<<(poVar6,pcVar8);
          std::__cxx11::string::string
                    ((string *)&buffer,"histogram",(allocator *)&histogram_calculation);
          sptk::PrintErrorMessage((string *)&buffer,&error_message_7);
        }
        std::__cxx11::string::~string((string *)&buffer);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
        iVar5 = 1;
        goto LAB_00103fbf;
      }
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_7);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&num_bin);
      bVar3 = num_bin < 1;
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -b option must be a positive integer")
        ;
        std::__cxx11::string::string((string *)&error_message_7,"histogram",(allocator *)&buffer);
        sptk::PrintErrorMessage((string *)&error_message_7,(ostringstream *)&ifs);
LAB_001039d1:
        std::__cxx11::string::~string((string *)&error_message_7);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
        return 1;
      }
    }
  } while( true );
LAB_00103baa:
  bVar3 = sptk::ReadStream<double>
                    (false,0,0,output_interval,&data,(istream *)input_stream,(int *)0x0);
  if (!bVar3) goto LAB_00103dce;
  bVar2 = sptk::HistogramCalculation::Run(&histogram_calculation,&data,&histogram);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
    std::operator<<((ostream *)&error_message_7,"Failed to calculate histogram");
    std::__cxx11::string::string((string *)&buffer,"histogram",(allocator *)&data_1);
    sptk::PrintErrorMessage((string *)&buffer,&error_message_7);
LAB_00103f86:
    std::__cxx11::string::~string((string *)&buffer);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
    iVar5 = 1;
    goto LAB_00103fa4;
  }
  if (bVar1) {
    dVar9 = 0.0;
    for (pdVar7 = histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar7 != histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
      dVar9 = dVar9 + *pdVar7;
    }
    if ((dVar9 == 0.0) && (!NAN(dVar9))) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
      poVar6 = std::operator<<((ostream *)&error_message_7,
                               "Failed to calculate normalized histogram at ");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar5);
      std::operator<<(poVar6,"th frame");
      std::__cxx11::string::string((string *)&buffer,"histogram",(allocator *)&data_1);
      sptk::PrintErrorMessage((string *)&buffer,&error_message_7);
      goto LAB_00103f86;
    }
    for (pdVar7 = histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar7 != histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
      *pdVar7 = *pdVar7 * (1.0 / dVar9);
    }
  }
  bVar2 = sptk::WriteStream<double>(0,num_bin,&histogram,(ostream *)&std::cout,(int *)0x0);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
    std::operator<<((ostream *)&error_message_7,"Failed to write histogram");
    std::__cxx11::string::string((string *)&buffer,"histogram",(allocator *)&data_1);
    sptk::PrintErrorMessage((string *)&buffer,&error_message_7);
    goto LAB_00103f86;
  }
  iVar5 = iVar5 + 1;
  goto LAB_00103baa;
LAB_00103dce:
  iVar5 = 0;
LAB_00103fa4:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  if (bVar3) goto LAB_00103fb5;
  goto LAB_00103fb2;
LAB_00103d37:
  bVar3 = sptk::ReadStream<double>(false,0,0,1,&data_1,(istream *)input_stream,(int *)0x0);
  if (bVar3) {
    bVar3 = sptk::HistogramCalculation::Run(&histogram_calculation,&data_1,&histogram);
    if (bVar3) goto code_r0x00103d6e;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
    std::operator<<((ostream *)&error_message_7,"Failed to calculate histogram");
    std::__cxx11::string::string((string *)&data,"histogram",&local_4e9);
    sptk::PrintErrorMessage((string *)&data,&error_message_7);
  }
  else {
    bVar3 = sptk::StatisticsAccumulation::GetSum(&statistics_accumulation,&buffer,&histogram);
    if (bVar3) {
      if (bVar1) {
        dVar9 = 0.0;
        for (pdVar7 = histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar7 != histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish; pdVar7 = pdVar7 + 1) {
          dVar9 = dVar9 + *pdVar7;
        }
        if ((dVar9 == 0.0) && (!NAN(dVar9))) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
          std::operator<<((ostream *)&error_message_7,"Failed to calculate normalized histogram");
          std::__cxx11::string::string((string *)&data,"histogram",&local_4e9);
          sptk::PrintErrorMessage((string *)&data,&error_message_7);
          goto LAB_0010410d;
        }
        for (; histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start !=
               histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
            histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
          *histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start =
               *histogram.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start * (1.0 / dVar9);
        }
      }
      iVar5 = 0;
      bVar3 = sptk::WriteStream<double>(0,num_bin,&histogram,(ostream *)&std::cout,(int *)0x0);
      bVar1 = true;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
        std::operator<<((ostream *)&error_message_7,"Failed to write histogram");
        std::__cxx11::string::string((string *)&data,"histogram",&local_4e9);
        sptk::PrintErrorMessage((string *)&data,&error_message_7);
        goto LAB_0010410d;
      }
      goto LAB_0010412c;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
    std::operator<<((ostream *)&error_message_7,"Failed to get histogram");
    std::__cxx11::string::string((string *)&data,"histogram",&local_4e9);
    sptk::PrintErrorMessage((string *)&data,&error_message_7);
  }
  goto LAB_0010410d;
code_r0x00103d6e:
  bVar3 = sptk::StatisticsAccumulation::Run(&statistics_accumulation,&histogram,&buffer);
  if (!bVar3) goto LAB_00103d80;
  goto LAB_00103d37;
LAB_00103d80:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_7);
  std::operator<<((ostream *)&error_message_7,"Failed to accumulate histogram");
  std::__cxx11::string::string((string *)&data,"histogram",&local_4e9);
  sptk::PrintErrorMessage((string *)&data,&error_message_7);
LAB_0010410d:
  std::__cxx11::string::~string((string *)&data);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_7);
  bVar1 = false;
  iVar5 = 1;
LAB_0010412c:
  sptk::StatisticsAccumulation::Buffer::~Buffer(&buffer);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data_1.super__Vector_base<double,_std::allocator<double>_>);
  if (!bVar1) goto LAB_00103fb5;
LAB_00103fb2:
  iVar5 = 0;
LAB_00103fb5:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&histogram.super__Vector_base<double,_std::allocator<double>_>);
LAB_00103fbf:
  std::ifstream::~ifstream(&ifs);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int output_interval(kMagicNumberForEndOfFile);
  int num_bin(kDefaultNumBin);
  double lower_bound(kDefaultLowerBound);
  double upper_bound(kDefaultUpperBound);
  bool normalization_flag(kDefaultNormalizationFlag);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "t:b:l:u:nh", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 't': {
        if (!sptk::ConvertStringToInteger(optarg, &output_interval) ||
            output_interval <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -t option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'b': {
        if (!sptk::ConvertStringToInteger(optarg, &num_bin) || num_bin <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -b option must be a positive integer";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'l': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_bound)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be numeric";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        break;
      }
      case 'n': {
        normalization_flag = true;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  if (upper_bound <= lower_bound) {
    std::ostringstream error_message;
    error_message << "Upper bound must be greater than lower bound";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::HistogramCalculation histogram_calculation(num_bin, lower_bound,
                                                   upper_bound);
  if (!histogram_calculation.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize HistogramCalculation";
    sptk::PrintErrorMessage("histogram", error_message);
    return 1;
  }

  std::vector<double> histogram(num_bin);

  if (kMagicNumberForEndOfFile == output_interval) {
    std::vector<double> data(1);
    sptk::StatisticsAccumulation statistics_accumulation(num_bin - 1, 1);
    sptk::StatisticsAccumulation::Buffer buffer;
    while (sptk::ReadStream(false, 0, 0, 1, &data, &input_stream, NULL)) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      if (!statistics_accumulation.Run(histogram, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to accumulate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }

    if (!statistics_accumulation.GetSum(buffer, &histogram)) {
      std::ostringstream error_message;
      error_message << "Failed to get histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }

    if (normalization_flag) {
      const double sum(
          std::accumulate(histogram.begin(), histogram.end(), 0.0));
      if (0.0 == sum) {
        std::ostringstream error_message;
        error_message << "Failed to calculate normalized histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
      const double z(1.0 / sum);
      std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                     [z](double x) { return x * z; });
    }

    if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write histogram";
      sptk::PrintErrorMessage("histogram", error_message);
      return 1;
    }
  } else {
    std::vector<double> data(output_interval);
    for (int frame_index(0); sptk::ReadStream(false, 0, 0, output_interval,
                                              &data, &input_stream, NULL);
         ++frame_index) {
      if (!histogram_calculation.Run(data, &histogram)) {
        std::ostringstream error_message;
        error_message << "Failed to calculate histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }

      if (normalization_flag) {
        const double sum(
            std::accumulate(histogram.begin(), histogram.end(), 0.0));
        if (0.0 == sum) {
          std::ostringstream error_message;
          error_message << "Failed to calculate normalized histogram at "
                        << frame_index << "th frame";
          sptk::PrintErrorMessage("histogram", error_message);
          return 1;
        }
        const double z(1.0 / sum);
        std::transform(histogram.begin(), histogram.end(), histogram.begin(),
                       [z](double x) { return x * z; });
      }

      if (!sptk::WriteStream(0, num_bin, histogram, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write histogram";
        sptk::PrintErrorMessage("histogram", error_message);
        return 1;
      }
    }
  }

  return 0;
}